

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareFontTables.cpp
# Opt level: O1

void CompareFeatTables(int *ec,TestCase *ptcase,GrIStream *grstrmB,GrIStream *grstrmT,
                      byte *pNameTblB,byte *pNameTblT)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ushort uVar9;
  wstring strT;
  wstring strB;
  int local_1f4;
  wstring local_1c8;
  wstring local_1a8;
  uint local_184;
  byte *local_180;
  byte *local_178;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_180 = pNameTblB;
  local_178 = pNameTblT;
  iVar2 = (*grstrmB->_vptr_GrIStream[4])(grstrmB);
  iVar3 = (*grstrmT->_vptr_GrIStream[4])(grstrmT);
  if (iVar3 < 0x20001) {
    uVar4 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
    uVar5 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
    uVar9 = (ushort)uVar4;
    uVar1 = (ushort)uVar5;
    if (uVar9 != uVar1) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"ERROR: Feat table - number of features","");
      OutputError(ec,ptcase,&local_70,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    (*grstrmB->_vptr_GrIStream[3])(grstrmB);
    (*grstrmT->_vptr_GrIStream[3])(grstrmT);
    (*grstrmB->_vptr_GrIStream[4])(grstrmB);
    (*grstrmT->_vptr_GrIStream[4])(grstrmT);
    if (uVar1 < uVar9) {
      uVar4 = uVar5;
    }
    if ((short)uVar4 == 0) {
      local_1f4 = 0;
    }
    else {
      local_184 = uVar4 & 0xffff;
      local_1f4 = 0;
      uVar4 = 0;
      do {
        if (iVar2 < 0x20000) {
          uVar5 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
          uVar5 = uVar5 & 0xffff;
        }
        else {
          uVar5 = (*grstrmB->_vptr_GrIStream[4])(grstrmB);
        }
        if (iVar3 == 0x20000) {
          uVar6 = (*grstrmT->_vptr_GrIStream[4])(grstrmT);
        }
        else {
          uVar6 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
          uVar6 = uVar6 & 0xffff;
        }
        if (uVar5 != uVar6) {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,"ERROR: Feat table - feature ID","");
          OutputError(ec,ptcase,&local_90,uVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        uVar5 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
        iVar7 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
        if ((short)uVar5 != (short)iVar7) {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,"ERROR: Feat table - feature","");
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,", number of settings","");
          OutputError(ec,ptcase,&local_d0,uVar4,&local_f0,-1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
        }
        if (0x1ffff < iVar2) {
          (*grstrmB->_vptr_GrIStream[2])(grstrmB);
        }
        if (iVar3 == 0x20000) {
          (*grstrmT->_vptr_GrIStream[2])(grstrmT);
        }
        (*grstrmB->_vptr_GrIStream[4])(grstrmB);
        (*grstrmT->_vptr_GrIStream[4])(grstrmT);
        iVar7 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
        iVar8 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
        if ((short)iVar7 != (short)iVar8) {
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_110,"ERROR: Feat table - feature","");
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,", flags","");
          OutputError(ec,ptcase,&local_110,uVar4,&local_130,-1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
        }
        iVar7 = (*grstrmB->_vptr_GrIStream[2])(grstrmB);
        iVar8 = (*grstrmT->_vptr_GrIStream[2])(grstrmT);
        StringFromNameTable_abi_cxx11_(&local_1a8,local_180,0x409,(int)(short)iVar7);
        StringFromNameTable_abi_cxx11_(&local_1c8,local_178,0x409,(int)(short)iVar8);
        iVar7 = wcscmp(local_1a8._M_dataplus._M_p,local_1c8._M_dataplus._M_p);
        if (iVar7 != 0) {
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_150,"ERROR: Feat table - label for feature","");
          OutputError(ec,ptcase,&local_150,uVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity * 4 + 4
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity * 4 + 4
                         );
        }
        local_1f4 = local_1f4 + (uVar5 & 0xffff);
        uVar4 = uVar4 + 1;
      } while (local_184 != uVar4);
    }
    if ((uVar9 == uVar1) && (local_1f4 != 0)) {
      iVar2 = 0;
      do {
        iVar3 = (*grstrmB->_vptr_GrIStream[2])(grstrmB);
        iVar7 = (*grstrmT->_vptr_GrIStream[2])(grstrmT);
        if ((short)iVar3 != (short)iVar7) {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"ERROR: Feat table - value for setting","");
          OutputError(ec,ptcase,&local_b0,iVar2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
        }
        uVar4 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
        uVar5 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
        StringFromNameTable_abi_cxx11_(&local_1a8,local_180,0x409,uVar4 & 0xffff);
        StringFromNameTable_abi_cxx11_(&local_1c8,local_178,0x409,uVar5 & 0xffff);
        iVar3 = wcscmp(local_1a8._M_dataplus._M_p,local_1c8._M_dataplus._M_p);
        if (iVar3 != 0) {
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_170,"ERROR: Feat table - label for setting","");
          OutputError(ec,ptcase,&local_170,iVar2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity * 4 + 4
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity * 4 + 4
                         );
        }
        iVar2 = iVar2 + 1;
      } while (local_1f4 != iVar2);
    }
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"ERROR: Feat table - unknown version number","");
    OutputError(ec,ptcase,&local_50,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void CompareFeatTables(int & ec, TestCase * ptcase, GrIStream & grstrmB, GrIStream & grstrmT,
	const gr::byte * pNameTblB, const gr::byte * pNameTblT)
{
	int fxdVersionB = ReadVersion(grstrmB);
	int fxdVersionT = ReadVersion(grstrmT);
    Assert(fxdVersionB <= kFeatVersion);
	if (fxdVersionT > kFeatVersion)
	{
		OutputError(ec, ptcase, "ERROR: Feat table - unknown version number");
		return;
	}
	
	//	number of features
	int cfeatB = grstrmB.ReadUShortFromFont();
	int cfeatT = grstrmT.ReadUShortFromFont();
	Assert(cfeatB <= kMaxFeatures);
	if (cfeatB != cfeatT)
		OutputError(ec, ptcase, "ERROR: Feat table - number of features");

	//	reserved
	grstrmB.ReadUShortFromFont();
	grstrmT.ReadUShortFromFont();
	grstrmB.ReadIntFromFont();
	grstrmT.ReadIntFromFont();
	
	int cfset = 0;
	int ifeat;
	for (ifeat = 0; ifeat < min(cfeatB, cfeatT); ifeat++)
	{
		//	ID
		featid nIdB, nIdT;
		if (fxdVersionB >= 0x00020000)
			nIdB = (unsigned int)grstrmB.ReadIntFromFont();
		else
			nIdB = grstrmB.ReadUShortFromFont();
		if (fxdVersionT >= 0x00020000)
			nIdT = (unsigned int)grstrmT.ReadIntFromFont();
		else
			nIdT = grstrmT.ReadUShortFromFont();
		if (nIdB != nIdT)
			OutputError(ec, ptcase, "ERROR: Feat table - feature ID", ifeat);

		//	number of settings
		data16 cfsetThis = grstrmB.ReadUShortFromFont();
		if (cfsetThis != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: Feat table - feature", ifeat, ", number of settings");
		cfset += cfsetThis;

		if (fxdVersionB >= 0x00020000)
			grstrmB.ReadShortFromFont(); // pad bytes
		if (fxdVersionT >= 0x00020000)
			grstrmT.ReadShortFromFont();

		//	offset to settings list
		grstrmB.ReadIntFromFont();
		grstrmT.ReadIntFromFont();

		//	flags
		if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: Feat table - feature", ifeat, ", flags");

		//	index into name table of UI label
		unsigned int nStrOffsetB = grstrmB.ReadShortFromFont();
		unsigned int nStrOffsetT = grstrmT.ReadShortFromFont();
		std::wstring strB = StringFromNameTable(pNameTblB, 1033, nStrOffsetB);
		std::wstring strT = StringFromNameTable(pNameTblT, 1033, nStrOffsetT);
		if (wcscmp(strB.c_str(), strT.c_str()) != 0)
			OutputError(ec, ptcase, "ERROR: Feat table - label for feature", ifeat);
	}

	if (cfeatB != cfeatT)
		return;

	// setttings
	for (int ifset = 0; ifset < cfset; ifset++)
	{
		if (grstrmB.ReadShortFromFont() != grstrmT.ReadShortFromFont())
			OutputError(ec, ptcase, "ERROR: Feat table - value for setting", ifset);

		// name table offsets
		unsigned int nStrOffsetB = grstrmB.ReadUShortFromFont();
		unsigned int nStrOffsetT = grstrmT.ReadUShortFromFont();
		std::wstring strB = StringFromNameTable(pNameTblB, 1033, nStrOffsetB);
		std::wstring strT = StringFromNameTable(pNameTblT, 1033, nStrOffsetT);
		if (wcscmp(strB.c_str(), strT.c_str()) != 0)
			OutputError(ec, ptcase, "ERROR: Feat table - label for setting", ifset);
	}
}